

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::_OnChangedClipRect(ImDrawList *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ImTextureID pvVar8;
  ImDrawCmd *pIVar9;
  ImDrawCmd *pIVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  pIVar9 = (this->CmdBuffer).Data;
  iVar12 = (this->CmdBuffer).Size;
  pIVar10 = pIVar9 + (long)iVar12 + -1;
  if ((pIVar9[(long)iVar12 + -1].ElemCount != 0) &&
     (auVar14[0] = -(*(char *)&(this->_CmdHeader).ClipRect.x == *(char *)&(pIVar10->ClipRect).x),
     auVar14[1] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.x + 1) ==
                   *(char *)((long)&pIVar9[(long)iVar12 + -1].ClipRect.x + 1)),
     auVar14[2] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.x + 2) ==
                   *(char *)((long)&pIVar9[(long)iVar12 + -1].ClipRect.x + 2)),
     auVar14[3] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.x + 3) ==
                   *(char *)((long)&pIVar9[(long)iVar12 + -1].ClipRect.x + 3)),
     auVar14[4] = -(*(char *)&(this->_CmdHeader).ClipRect.y ==
                   *(char *)&pIVar9[(long)iVar12 + -1].ClipRect.y),
     auVar14[5] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.y + 1) ==
                   *(char *)((long)&pIVar9[(long)iVar12 + -1].ClipRect.y + 1)),
     auVar14[6] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.y + 2) ==
                   *(char *)((long)&pIVar9[(long)iVar12 + -1].ClipRect.y + 2)),
     auVar14[7] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.y + 3) ==
                   *(char *)((long)&pIVar9[(long)iVar12 + -1].ClipRect.y + 3)),
     auVar14[8] = -(*(char *)&(this->_CmdHeader).ClipRect.z ==
                   *(char *)&pIVar9[(long)iVar12 + -1].ClipRect.z),
     auVar14[9] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.z + 1) ==
                   *(char *)((long)&pIVar9[(long)iVar12 + -1].ClipRect.z + 1)),
     auVar14[10] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.z + 2) ==
                    *(char *)((long)&pIVar9[(long)iVar12 + -1].ClipRect.z + 2)),
     auVar14[0xb] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.z + 3) ==
                     *(char *)((long)&pIVar9[(long)iVar12 + -1].ClipRect.z + 3)),
     auVar14[0xc] = -(*(char *)&(this->_CmdHeader).ClipRect.w ==
                     *(char *)&pIVar9[(long)iVar12 + -1].ClipRect.w),
     auVar14[0xd] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.w + 1) ==
                     *(char *)((long)&pIVar9[(long)iVar12 + -1].ClipRect.w + 1)),
     auVar14[0xe] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.w + 2) ==
                     *(char *)((long)&pIVar9[(long)iVar12 + -1].ClipRect.w + 2)),
     auVar14[0xf] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.w + 3) ==
                     *(char *)((long)&pIVar9[(long)iVar12 + -1].ClipRect.w + 3)),
     (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(auVar14[0xf] >> 7) << 0xf)
     != 0xffff)) {
    fVar1 = (this->_CmdHeader).ClipRect.x;
    fVar2 = (this->_CmdHeader).ClipRect.z;
    if (fVar1 <= fVar2) {
      fVar3 = (this->_CmdHeader).ClipRect.y;
      fVar4 = (this->_CmdHeader).ClipRect.w;
      if (fVar3 <= fVar4) {
        pvVar8 = (this->_CmdHeader).TextureId;
        uVar5 = (this->_CmdHeader).VtxOffset;
        uVar6 = (this->IdxBuffer).Size;
        iVar12 = (this->CmdBuffer).Size;
        iVar7 = (this->CmdBuffer).Capacity;
        if (iVar12 == iVar7) {
          iVar12 = iVar12 + 1;
          if (iVar7 == 0) {
            iVar11 = 8;
          }
          else {
            iVar11 = iVar7 / 2 + iVar7;
          }
          if (iVar12 < iVar11) {
            iVar12 = iVar11;
          }
          if (iVar7 < iVar12) {
            pIVar10 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar12 * 0x38);
            pIVar9 = (this->CmdBuffer).Data;
            if (pIVar9 != (ImDrawCmd *)0x0) {
              memcpy(pIVar10,pIVar9,(long)(this->CmdBuffer).Size * 0x38);
              ImGui::MemFree((this->CmdBuffer).Data);
            }
            (this->CmdBuffer).Data = pIVar10;
            (this->CmdBuffer).Capacity = iVar12;
          }
        }
        pIVar9 = (this->CmdBuffer).Data;
        iVar12 = (this->CmdBuffer).Size;
        pIVar9[iVar12].ClipRect.x = fVar1;
        pIVar9[iVar12].ClipRect.y = fVar3;
        pIVar9[iVar12].ClipRect.z = fVar2;
        pIVar9[iVar12].ClipRect.w = fVar4;
        pIVar9[iVar12].TextureId = pvVar8;
        pIVar9[iVar12].VtxOffset = uVar5;
        pIVar9[iVar12].IdxOffset = uVar6;
        *(undefined8 *)&pIVar9[iVar12].ElemCount = 0;
        *(ImDrawCallback *)(&pIVar9[iVar12].ElemCount + 2) = (ImDrawCallback)0x0;
        pIVar9[iVar12].UserCallbackData = (void *)0x0;
        (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
        return;
      }
    }
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui_draw.cpp"
                  ,0x1b2,"void ImDrawList::AddDrawCmd()");
  }
  if (pIVar9[(long)iVar12 + -1].UserCallback != (ImDrawCallback)0x0) {
    __assert_fail("curr_cmd->UserCallback == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui_draw.cpp"
                  ,0x1e0,"void ImDrawList::_OnChangedClipRect()");
  }
  if ((((1 < iVar12) && (pIVar9[(long)iVar12 + -1].ElemCount == 0)) &&
      (auVar15[0] = -(*(char *)&pIVar9[(long)iVar12 + -2].ClipRect.x ==
                     *(char *)&(this->_CmdHeader).ClipRect.x),
      auVar15[1] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].ClipRect.x + 1) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.x + 1)),
      auVar15[2] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].ClipRect.x + 2) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.x + 2)),
      auVar15[3] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].ClipRect.x + 3) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.x + 3)),
      auVar15[4] = -(*(char *)&pIVar9[(long)iVar12 + -2].ClipRect.y ==
                    *(char *)&(this->_CmdHeader).ClipRect.y),
      auVar15[5] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].ClipRect.y + 1) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.y + 1)),
      auVar15[6] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].ClipRect.y + 2) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.y + 2)),
      auVar15[7] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].ClipRect.y + 3) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.y + 3)),
      auVar15[8] = -(*(char *)&pIVar9[(long)iVar12 + -2].ClipRect.z ==
                    *(char *)&(this->_CmdHeader).ClipRect.z),
      auVar15[9] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].ClipRect.z + 1) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.z + 1)),
      auVar15[10] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].ClipRect.z + 2) ==
                     *(char *)((long)&(this->_CmdHeader).ClipRect.z + 2)),
      auVar15[0xb] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].ClipRect.z + 3) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.z + 3)),
      auVar15[0xc] = -(*(char *)&pIVar9[(long)iVar12 + -2].ClipRect.w ==
                      *(char *)&(this->_CmdHeader).ClipRect.w),
      auVar15[0xd] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].ClipRect.w + 1) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.w + 1)),
      auVar15[0xe] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].ClipRect.w + 2) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.w + 2)),
      auVar15[0xf] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].ClipRect.w + 3) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.w + 3)),
      auVar13[0] = -(*(char *)&pIVar9[(long)iVar12 + -2].ClipRect.w ==
                    *(char *)&(this->_CmdHeader).ClipRect.w),
      auVar13[1] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].ClipRect.w + 1) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.w + 1)),
      auVar13[2] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].ClipRect.w + 2) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.w + 2)),
      auVar13[3] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].ClipRect.w + 3) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.w + 3)),
      auVar13[4] = -(*(char *)&pIVar9[(long)iVar12 + -2].TextureId ==
                    *(char *)&(this->_CmdHeader).TextureId),
      auVar13[5] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].TextureId + 1) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 1)),
      auVar13[6] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].TextureId + 2) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 2)),
      auVar13[7] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].TextureId + 3) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 3)),
      auVar13[8] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].TextureId + 4) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 4)),
      auVar13[9] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].TextureId + 5) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 5)),
      auVar13[10] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].TextureId + 6) ==
                     *(char *)((long)&(this->_CmdHeader).TextureId + 6)),
      auVar13[0xb] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].TextureId + 7) ==
                      *(char *)((long)&(this->_CmdHeader).TextureId + 7)),
      auVar13[0xc] = -((char)pIVar9[(long)iVar12 + -2].VtxOffset ==
                      (char)(this->_CmdHeader).VtxOffset),
      auVar13[0xd] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].VtxOffset + 1) ==
                      *(char *)((long)&(this->_CmdHeader).VtxOffset + 1)),
      auVar13[0xe] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].VtxOffset + 2) ==
                      *(char *)((long)&(this->_CmdHeader).VtxOffset + 2)),
      auVar13[0xf] = -(*(char *)((long)&pIVar9[(long)iVar12 + -2].VtxOffset + 3) ==
                      *(char *)((long)&(this->_CmdHeader).VtxOffset + 3)),
      auVar13 = auVar13 & auVar15,
      (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff)) &&
     (pIVar9[(long)iVar12 + -2].UserCallback == (ImDrawCallback)0x0)) {
    (this->CmdBuffer).Size = iVar12 + -1;
    return;
  }
  fVar1 = (this->_CmdHeader).ClipRect.y;
  fVar2 = (this->_CmdHeader).ClipRect.z;
  fVar3 = (this->_CmdHeader).ClipRect.w;
  (pIVar10->ClipRect).x = (this->_CmdHeader).ClipRect.x;
  (pIVar10->ClipRect).y = fVar1;
  pIVar9[(long)iVar12 + -1].ClipRect.z = fVar2;
  pIVar9[(long)iVar12 + -1].ClipRect.w = fVar3;
  return;
}

Assistant:

void ImDrawList::_OnChangedClipRect()
{
    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &_CmdHeader.ClipRect, sizeof(ImVec4)) != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (curr_cmd->ElemCount == 0 && CmdBuffer.Size > 1 && ImDrawCmd_HeaderCompare(&_CmdHeader, prev_cmd) == 0 && prev_cmd->UserCallback == NULL)
    {
        CmdBuffer.pop_back();
        return;
    }

    curr_cmd->ClipRect = _CmdHeader.ClipRect;
}